

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O2

int AF_A_SorcBallOrbit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  VM_UBYTE VVar4;
  int iVar5;
  DObject *this;
  PClass *pPVar6;
  bool bVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  FState *pFVar10;
  PClass *pPVar11;
  AActor *this_00;
  FName *label;
  char *__assertion;
  PClass *pPVar12;
  FSoundID local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  DAngle local_48;
  DVector3 pos;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053c2ec;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0053c2dc:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0053c2ec:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this_00 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag != 1) {
    if (this_00 == (AActor *)0x0) goto LAB_0053be87;
    goto LAB_0053c2dc;
  }
  if (this_00 == (AActor *)0x0) {
LAB_0053be87:
    this_00 = (AActor *)0x0;
  }
  else {
    bVar7 = DObject::IsKindOf((DObject *)this_00,ASorcBall::RegistrationInfo.MyClass);
    if (!bVar7) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(ASorcBall))";
      goto LAB_0053c2ec;
    }
  }
  if (numparam != 1) {
    VVar4 = param[1].field_0.field_3.Type;
    if (VVar4 != 0xff) {
      if (VVar4 != '\x03') goto LAB_0053c2dc;
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar7 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar7)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053c2ec;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0053c2dc;
    }
    if (((2 < (uint)numparam) && (VVar4 = param[2].field_0.field_3.Type, VVar4 != 0xff)) &&
       ((VVar4 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053c2ec;
    }
  }
  obj = &this_00->target;
  pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar8 == (AActor *)0x0) {
    label = &local_4c;
LAB_0053bfd3:
    label->Index = 0x83;
    pFVar10 = AActor::FindState(this_00,label);
    AActor::SetState(this_00,pFVar10,false);
    return 0;
  }
  pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
  iVar5 = pAVar8->args[3];
  pAVar8 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar1 = pAVar8->radius;
  dVar2 = this_00->radius;
  pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar9->health < 1) {
    label = &local_50;
    goto LAB_0053bfd3;
  }
  pPVar3 = this_00[1].super_DThinker.super_DObject.Class;
  pPVar12 = (PClass *)
            ((double)pAVar8[1].super_DThinker.super_DObject.Class +
            (double)this_00[1].super_DThinker.super_DObject._vptr_DObject);
  (this_00->Angles).Yaw.Degrees = (double)pPVar12;
  switch(iVar5) {
  case 0:
    A_DecelBalls(this_00);
  case 5:
switchD_0053bfbb_caseD_5:
    (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x26])(this_00);
    break;
  case 1:
    A_AccelBalls(this_00);
    goto switchD_0053bfbb_caseD_5;
  case 2:
    pPVar6 = (PClass *)pAVar8[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar11 = DObject::GetClass((DObject *)this_00);
    if (((pPVar6 != pPVar11) || (pAVar8->args[1] < 6)) ||
       (42.1875 <=
        ABS((double)SUB84(((double)pPVar12 - (pAVar8->Angles).Yaw.Degrees) * 11930464.711111112 +
                          6755399441055744.0,0) * 8.381903171539307e-08))) {
      (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x26])(this_00);
    }
    else {
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar9->args[3] = 3;
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar9->args[4] = 0;
      pAVar8[1].super_DThinker.super_DObject.Class =
           (PClass *)
           ((pAVar8->Angles).Yaw.Degrees -
           (double)this_00[1].super_DThinker.super_DObject._vptr_DObject);
    }
    break;
  case 3:
    pPVar6 = (PClass *)pAVar8[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar11 = DObject::GetClass((DObject *)this_00);
    if (pPVar6 == pPVar11) {
      if (0 < pAVar8->health) {
        FName::FName(&local_54,"Attack1");
        pFVar10 = AActor::FindState(pAVar8,&local_54);
        AActor::SetState(pAVar8,pFVar10,false);
      }
      (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x25])(this_00);
    }
    break;
  case 6:
    pPVar6 = (PClass *)pAVar8[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar11 = DObject::GetClass((DObject *)this_00);
    if (pPVar6 == pPVar11) {
      iVar5 = this_00->special2;
      this_00->special2 = iVar5 + -1;
      if (iVar5 < 1) {
        pAVar8->args[3] = 4;
        if (0 < pAVar8->health) {
          FName::FName(&local_58,"Attack2");
          pFVar10 = AActor::FindState(pAVar8,&local_58);
          AActor::SetState(pAVar8,pFVar10,false);
        }
      }
      else {
        A_SorcOffense2(this_00);
      }
    }
  }
  if ((SUB84((double)pPVar12 * 11930464.711111112 + 6755399441055744.0,0) <
       SUB84((double)pPVar3 * 11930464.711111112 + 6755399441055744.0,0)) &&
     (pAVar8->args[4] == 0x19)) {
    pAVar8->args[1] = pAVar8->args[1] + 1;
    local_5c.ID = S_FindSound("SorcererBallWoosh");
    S_Sound(this_00,4,&local_5c,1.0,1.0);
  }
  this_00[1].super_DThinker.super_DObject.Class = pPVar12;
  local_48.Degrees = (double)pPVar12;
  AActor::Vec3Angle(&pos,pAVar8,dVar1 - (dVar2 + dVar2),&local_48,pAVar8->Height - pAVar8->Floorclip
                    ,false);
  (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x22])(pos.X,pos.Y,pos.Z,this_00,1);
  dVar1 = pAVar8->ceilingz;
  this_00->floorz = pAVar8->floorz;
  this_00->ceilingz = dVar1;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcBallOrbit)
{
	PARAM_ACTION_PROLOGUE_TYPE(ASorcBall);

	// [RH] If no parent, then die instead of crashing
	if (self->target == NULL)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	int mode = self->target->args[3];
	AHeresiarch *parent = barrier_cast<AHeresiarch *>(self->target);
	double dist = parent->radius - (self->radius*2);

#if 0
	// This cannot happen anymore because this is defined locally in SorcBall
	if (!self->IsKindOf (RUNTIME_CLASS(ASorcBall)))
	{
		I_Error ("Corrupted sorcerer:\nTried to use a %s", self->GetClass()->TypeName.GetChars());
	}
#endif

	if (self->target->health <= 0)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	DAngle prevangle = self->OldAngle;
	DAngle baseangle = parent->BallAngle;
	DAngle angle = baseangle + self->AngleOffset;

	self->Angles.Yaw = angle;

	switch (mode)
	{
	case SORC_NORMAL:			// Balls rotating normally
		self->SorcUpdateBallAngle ();
		break;

	case SORC_DECELERATE:		// Balls decelerating
		A_DecelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_ACCELERATE:		// Balls accelerating
		A_AccelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_STOPPING:			// Balls stopping
		if ((parent->StopBall == self->GetClass()) &&
			 (parent->args[1] > SORCBALL_SPEED_ROTATIONS) &&
			 absangle(angle, parent->Angles.Yaw) < 42.1875)
		{
			// Can stop now
			self->target->args[3] = SORC_FIRESPELL;
			self->target->args[4] = 0;
			// Set angle so self angle == sorcerer angle
			parent->BallAngle = parent->Angles.Yaw - self->AngleOffset;
		}
		else
		{
			self->SorcUpdateBallAngle ();
		}
		break;

	case SORC_FIRESPELL:			// Casting spell
		if (parent->StopBall == self->GetClass())
		{
			// Put sorcerer into special throw spell anim
			if (parent->health > 0)
				parent->SetState (parent->FindState("Attack1"));

			self->DoFireSpell ();
		}
		break;

	case SORC_FIRING_SPELL:
		if (parent->StopBall == self->GetClass())
		{
			if (self->special2-- <= 0)
			{
				// Done rapid firing 
				parent->args[3] = SORC_STOPPED;
				// Back to orbit balls
				if (parent->health > 0)
					parent->SetState (parent->FindState("Attack2"));
			}
			else
			{
				// Do rapid fire spell
				A_SorcOffense2(self);
			}
		}
		break;

	case SORC_STOPPED:			// Balls stopped
	default:
		break;
	}

	if ( angle.BAMs() < prevangle.BAMs() && (parent->args[4]==SORCBALL_TERMINAL_SPEED))
	{
		parent->args[1]++;			// Bump rotation counter
		// Completed full rotation - make woosh sound
		S_Sound (self, CHAN_BODY, "SorcererBallWoosh", 1, ATTN_NORM);
	}
	self->OldAngle = angle;		// Set previous angle

	DVector3 pos = parent->Vec3Angle(dist, angle, -parent->Floorclip + parent->Height);
	self->SetOrigin (pos, true);
	self->floorz = parent->floorz;
	self->ceilingz = parent->ceilingz;
	return 0;
}